

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseNotationDecl(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  int iVar2;
  xmlChar *pxVar3;
  int inputid;
  xmlChar *Systemid;
  xmlChar *Pubid;
  xmlChar *name;
  xmlParserCtxtPtr ctxt_local;
  
  if ((((((*ctxt->input->cur == '<') && (ctxt->input->cur[1] == '!')) &&
        (ctxt->input->cur[2] == 'N')) &&
       (((ctxt->input->cur[3] == 'O' && (ctxt->input->cur[4] == 'T')) &&
        ((ctxt->input->cur[5] == 'A' &&
         ((ctxt->input->cur[6] == 'T' && (ctxt->input->cur[7] == 'I')))))))) &&
      (ctxt->input->cur[8] == 'O')) && (ctxt->input->cur[9] == 'N')) {
    iVar1 = ctxt->input->id;
    name = (xmlChar *)ctxt;
    if (((ctxt->progressive == 0) && (500 < (long)ctxt->input->cur - (long)ctxt->input->base)) &&
       ((long)ctxt->input->end - (long)ctxt->input->cur < 500)) {
      xmlSHRINK(ctxt);
    }
    *(long *)(*(long *)(name + 0x38) + 0x20) = *(long *)(*(long *)(name + 0x38) + 0x20) + 10;
    *(int *)(*(long *)(name + 0x38) + 0x38) = *(int *)(*(long *)(name + 0x38) + 0x38) + 10;
    if (**(char **)(*(long *)(name + 0x38) + 0x20) == '\0') {
      xmlParserInputGrow(*(xmlParserInputPtr *)(name + 0x38),0xfa);
    }
    iVar2 = xmlSkipBlankChars((xmlParserCtxtPtr)name);
    if (iVar2 == 0) {
      xmlFatalErrMsg((xmlParserCtxtPtr)name,XML_ERR_SPACE_REQUIRED,
                     "Space required after \'<!NOTATION\'\n");
    }
    else {
      Pubid = xmlParseName((xmlParserCtxtPtr)name);
      if (Pubid == (xmlChar *)0x0) {
        xmlFatalErr((xmlParserCtxtPtr)name,XML_ERR_NOTATION_NOT_STARTED,(char *)0x0);
      }
      else {
        pxVar3 = xmlStrchr(Pubid,':');
        if (pxVar3 != (xmlChar *)0x0) {
          xmlNsErr((xmlParserCtxtPtr)name,XML_NS_ERR_COLON,
                   "colons are forbidden from notation names \'%s\'\n",Pubid,(xmlChar *)0x0,
                   (xmlChar *)0x0);
        }
        iVar2 = xmlSkipBlankChars((xmlParserCtxtPtr)name);
        if (iVar2 == 0) {
          xmlFatalErrMsg((xmlParserCtxtPtr)name,XML_ERR_SPACE_REQUIRED,
                         "Space required after the NOTATION name\'\n");
        }
        else {
          pxVar3 = xmlParseExternalID((xmlParserCtxtPtr)name,&Systemid,0);
          xmlSkipBlankChars((xmlParserCtxtPtr)name);
          if (**(char **)(*(long *)(name + 0x38) + 0x20) == '>') {
            if (iVar1 != *(int *)(*(long *)(name + 0x38) + 100)) {
              xmlFatalErrMsg((xmlParserCtxtPtr)name,XML_ERR_ENTITY_BOUNDARY,
                             "Notation declaration doesn\'t start and stop in the same entity\n");
            }
            xmlNextChar((xmlParserCtxtPtr)name);
            if (((*(long *)name != 0) && (*(int *)(name + 0x14c) == 0)) &&
               (*(long *)(*(long *)name + 0x38) != 0)) {
              (**(code **)(*(long *)name + 0x38))(*(undefined8 *)(name + 8),Pubid,Systemid,pxVar3);
            }
          }
          else {
            xmlFatalErr((xmlParserCtxtPtr)name,XML_ERR_NOTATION_NOT_FINISHED,(char *)0x0);
          }
          if (pxVar3 != (xmlChar *)0x0) {
            (*xmlFree)(pxVar3);
          }
          if (Systemid != (xmlChar *)0x0) {
            (*xmlFree)(Systemid);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
xmlParseNotationDecl(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    xmlChar *Pubid;
    xmlChar *Systemid;

    if (CMP10(CUR_PTR, '<', '!', 'N', 'O', 'T', 'A', 'T', 'I', 'O', 'N')) {
	int inputid = ctxt->input->id;
	SHRINK;
	SKIP(10);
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			   "Space required after '<!NOTATION'\n");
	    return;
	}

        name = xmlParseName(ctxt);
	if (name == NULL) {
	    xmlFatalErr(ctxt, XML_ERR_NOTATION_NOT_STARTED, NULL);
	    return;
	}
	if (xmlStrchr(name, ':') != NULL) {
	    xmlNsErr(ctxt, XML_NS_ERR_COLON,
		     "colons are forbidden from notation names '%s'\n",
		     name, NULL, NULL);
	}
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		     "Space required after the NOTATION name'\n");
	    return;
	}

	/*
	 * Parse the IDs.
	 */
	Systemid = xmlParseExternalID(ctxt, &Pubid, 0);
	SKIP_BLANKS;

	if (RAW == '>') {
	    if (inputid != ctxt->input->id) {
		xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
	                       "Notation declaration doesn't start and stop"
                               " in the same entity\n");
	    }
	    NEXT;
	    if ((ctxt->sax != NULL) && (!ctxt->disableSAX) &&
		(ctxt->sax->notationDecl != NULL))
		ctxt->sax->notationDecl(ctxt->userData, name, Pubid, Systemid);
	} else {
	    xmlFatalErr(ctxt, XML_ERR_NOTATION_NOT_FINISHED, NULL);
	}
	if (Systemid != NULL) xmlFree(Systemid);
	if (Pubid != NULL) xmlFree(Pubid);
    }
}